

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

MRIStepCoupling MRIStepCoupling_Copy(MRIStepCoupling MRIC)

{
  int iVar1;
  int *in_RDI;
  MRIStepCoupling MRICcopy;
  MRISTEP_METHOD_TYPE type;
  int stages;
  int nmat;
  int k;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffd0;
  int stages_00;
  int nmat_00;
  int local_1c;
  int local_18;
  int local_14;
  MRIStepCoupling local_8;
  
  if (in_RDI == (int *)0x0) {
    local_8 = (MRIStepCoupling)0x0;
  }
  else {
    if ((*(long *)(in_RDI + 6) == 0) || (*(long *)(in_RDI + 8) == 0)) {
      if ((*(long *)(in_RDI + 6) == 0) || (*(long *)(in_RDI + 8) != 0)) {
        if ((*(long *)(in_RDI + 6) != 0) || (*(long *)(in_RDI + 8) == 0)) {
          return (MRIStepCoupling)0x0;
        }
        stages_00 = 1;
      }
      else {
        stages_00 = 0;
      }
    }
    else {
      stages_00 = 2;
    }
    if (*(long *)(in_RDI + 4) == 0) {
      local_8 = (MRIStepCoupling)0x0;
    }
    else {
      iVar1 = *in_RDI;
      nmat_00 = in_RDI[1];
      local_8 = MRIStepCoupling_Alloc
                          (nmat_00,stages_00,
                           (MRISTEP_METHOD_TYPE)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      if (local_8 == (MRIStepCoupling)0x0) {
        local_8 = (MRIStepCoupling)0x0;
      }
      else {
        local_8->q = in_RDI[2];
        local_8->p = in_RDI[3];
        for (local_14 = 0; local_14 < nmat_00; local_14 = local_14 + 1) {
          local_8->c[local_14] = *(realtype *)(*(long *)(in_RDI + 4) + (long)local_14 * 8);
        }
        if (*(long *)(in_RDI + 6) != 0) {
          for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
            for (local_14 = 0; local_14 < nmat_00; local_14 = local_14 + 1) {
              for (local_18 = 0; local_18 < nmat_00; local_18 = local_18 + 1) {
                local_8->W[local_1c][local_14][local_18] =
                     *(realtype *)
                      (*(long *)(*(long *)(*(long *)(in_RDI + 6) + (long)local_1c * 8) +
                                (long)local_14 * 8) + (long)local_18 * 8);
              }
            }
          }
        }
        if (*(long *)(in_RDI + 8) != 0) {
          for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
            for (local_14 = 0; local_14 < nmat_00; local_14 = local_14 + 1) {
              for (local_18 = 0; local_18 < nmat_00; local_18 = local_18 + 1) {
                local_8->G[local_1c][local_14][local_18] =
                     *(realtype *)
                      (*(long *)(*(long *)(*(long *)(in_RDI + 8) + (long)local_1c * 8) +
                                (long)local_14 * 8) + (long)local_18 * 8);
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Copy(MRIStepCoupling MRIC)
{
  int i, j, k, nmat, stages;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRICcopy;

  /* Check for legal input */
  if (!MRIC) return(NULL);

  /* Check for method coefficients and set method type */
  if (MRIC->W && MRIC->G)
    type = MRISTEP_IMEX;
  else if (MRIC->W && !(MRIC->G))
    type = MRISTEP_EXPLICIT;
  else if (!(MRIC->W) && MRIC->G)
    type = MRISTEP_IMPLICIT;
  else
    return(NULL);

  /* Check for stage times */
  if (!(MRIC->c)) return(NULL);

  /* Get the number of coupling matrices and stages */
  nmat   = MRIC->nmat;
  stages = MRIC->stages;

  /* Allocate coupling structure */
  MRICcopy = MRIStepCoupling_Alloc(nmat, stages, type);
  if (!MRICcopy) return(NULL);

  /* Copy method and embedding orders */
  MRICcopy->q = MRIC->q;
  MRICcopy->p = MRIC->p;

  /* Copy abscissae */
  for (i=0; i<stages; i++)
    MRICcopy->c[i] = MRIC->c[i];

  /* Copy explicit coupling matrices W */
  if (MRIC->W)
    for (k = 0; k < nmat; k++)
      for (i = 0; i < stages; i++)
        for (j = 0; j < stages; j++)
          MRICcopy->W[k][i][j] = MRIC->W[k][i][j];

  /* Copy implicit coupling matrices G */
  if (MRIC->G)
    for (k = 0; k < nmat; k++)
      for (i = 0; i < stages; i++)
        for (j = 0; j < stages; j++)
          MRICcopy->G[k][i][j] = MRIC->G[k][i][j];

  return(MRICcopy);
}